

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setCurrentText(QComboBox *this,QString *text)

{
  int index;
  
  if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2a0) != 0) {
    setEditText(this,text);
    return;
  }
  index = findText(this,text,(MatchFlags)0x10);
  if (-1 < index) {
    setCurrentIndex(this,index);
    return;
  }
  return;
}

Assistant:

void QComboBox::setCurrentText(const QString &text)
{
    if (isEditable()) {
        setEditText(text);
    } else {
        const int i = findText(text);
        if (i > -1)
            setCurrentIndex(i);
    }
}